

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

int sptk::snack::lc_lin_fir(float fc,int *nf,float *coef)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  double dVar4;
  double c;
  double fn;
  double twopi;
  int n;
  int i;
  int local_1c;
  
  if (*in_RDI % 2 != 1) {
    *in_RDI = *in_RDI + 1;
  }
  iVar2 = (*in_RDI + 1) / 2;
  *in_RSI = in_XMM0_Da * 2.0;
  for (local_1c = 1; local_1c < iVar2; local_1c = local_1c + 1) {
    dVar4 = sin((double)local_1c * (double)in_XMM0_Da * 6.283185307179586);
    in_RSI[local_1c] = (float)(dVar4 / ((double)local_1c * 3.141592653589793));
  }
  iVar1 = *in_RDI;
  for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
    dVar4 = cos((6.283185307179586 / (double)iVar1) * ((double)local_1c + 0.5));
    iVar3 = (iVar2 - local_1c) + -1;
    in_RSI[iVar3] = (float)(dVar4 * -0.5 + 0.5) * in_RSI[iVar3];
  }
  return 1;
}

Assistant:

static int lc_lin_fir(float fc, int *nf, float *coef)
#endif
{
    register int	i, n;
    register double	twopi, fn, c;

    if(((*nf % 2) != 1))
	*nf = *nf + 1;
    n = (*nf + 1)/2;

    /*  Compute part of the ideal impulse response (the sin(x)/x kernel). */
    twopi = M_PI * 2.0;
    coef[0] = (float) (2.0 * fc);
    c = M_PI;
    fn = twopi * fc;
    for(i=1;i < n; i++) coef[i] = (float)(sin(i * fn)/(c * i));

    /* Now apply a Hanning window to the (infinite) impulse response. */
    /* (Probably should use a better window, like Kaiser...) */
    fn = twopi/(double)(*nf);
    for(i=0;i<n;i++) 
	coef[n-i-1] *= (float)((.5 - (.5 * cos(fn * ((double)i + 0.5)))));
    
    return(TRUE);
}